

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

string * __thiscall
jessilib::
join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>&,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
          (string *__return_storage_ptr__,jessilib *this,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *args,
          basic_string_view<char32_t,_std::char_traits<char32_t>_> *args_1,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *args_2)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  impl_join::
  join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>&,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (__return_storage_ptr__,(basic_string_view<char8_t,_std::char_traits<char8_t>_> *)this,
             (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)args,
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string join_mbstring(ArgsT&&... args) {
	std::string result;
	impl_join::join_mb_append<ArgsT...>(result, std::forward<ArgsT>(args)...);
	return result;
}